

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

IEventListenerPtr __thiscall
Catch::ReporterRegistry::create(ReporterRegistry *this,string *name,ReporterConfig *config)

{
  const_iterator cVar1;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
                  *)((name->_M_dataplus)._M_p + 0x18),(key_type *)config);
  if (cVar1._M_node == (_Base_ptr)((name->_M_dataplus)._M_p + 0x20)) {
    (this->m_impl).m_ptr = (ReporterRegistryImpl *)0x0;
  }
  else {
    (**(code **)(**(long **)(cVar1._M_node + 2) + 0x10))(this);
  }
  return (IEventListenerPtr)(IEventListener *)this;
}

Assistant:

IEventListenerPtr
    ReporterRegistry::create( std::string const& name,
                              ReporterConfig&& config ) const {
        auto it = m_impl->factories.find( name );
        if ( it == m_impl->factories.end() ) return nullptr;
        return it->second->create( CATCH_MOVE( config ) );
    }